

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O3

bool __thiscall
ADSBHubConnection::StreamProcessDataSBSLine(ADSBHubConnection *this,char *pStart,char *pEnd)

{
  _Alloc_hider _Var1;
  int iVar2;
  int *piVar3;
  long lVar4;
  time_t tVar5;
  undefined8 uVar6;
  logLevelTy lvl;
  bool bVar7;
  char *szMsg;
  double dVar8;
  string token;
  tm tm;
  FDKeyTy key;
  char *local_230;
  string local_228;
  char *local_208;
  string local_200;
  int local_1dc;
  undefined1 local_1d8 [20];
  int iStack_1c4;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  long lStack_1b0;
  char *local_1a8;
  string local_1a0;
  FDKeyTy local_180;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_230 = pStart;
  readToken_abi_cxx11_(&local_200,&local_230,pEnd,',');
  iVar2 = std::__cxx11::string::compare((char *)&local_200);
  if (iVar2 == 0) {
    readToken_abi_cxx11_(&local_50,&local_230,pEnd,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    readToken_abi_cxx11_(&local_70,&local_230,pEnd,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    readToken_abi_cxx11_(&local_90,&local_230,pEnd,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_230 <= pEnd) {
      readToken_abi_cxx11_((string *)local_1d8,&local_230,pEnd,',');
      std::__cxx11::string::operator=((string *)&local_200,(string *)local_1d8);
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,stack0xfffffffffffffe38 + 1);
      }
      if (pEnd < local_230) {
        if (3 < (int)dataRefs.iLogLevel) goto LAB_0014be61;
        szMsg = "Line too short, just only read an ADS-B hex id";
        lvl = logERR;
        iVar2 = 0x141;
      }
      else {
        if (local_200._M_string_length != 0) {
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,local_200._M_dataplus._M_p,
                     local_200._M_dataplus._M_p + local_200._M_string_length);
          LTFlightData::FDKeyTy::FDKeyTy(&local_180,KEY_ICAO,&local_1a0,0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if (((this->fdKey).eKeyType != local_180.eKeyType) || ((this->fdKey).num != local_180.num)
             ) {
            ProcessPlaneData(this);
            (this->fdKey).eKeyType = local_180.eKeyType;
            std::__cxx11::string::_M_assign((string *)&(this->fdKey).key);
            (this->fdKey).num = local_180.num;
          }
          readToken_abi_cxx11_(&local_b0,&local_230,pEnd,',');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          readToken_abi_cxx11_(&local_d0,&local_230,pEnd,',');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          readToken_abi_cxx11_(&local_f0,&local_230,pEnd,',');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (pEnd < local_230) {
            if ((int)dataRefs.iLogLevel < 4) {
              bVar7 = false;
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                     ,0x153,"StreamProcessDataSBSLine",logERR,
                     "Line too short, not yet read date/time of message created");
            }
            else {
              bVar7 = false;
            }
LAB_0014cb15:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180.key._M_dataplus._M_p != &local_180.key.field_2) {
              operator_delete(local_180.key._M_dataplus._M_p,
                              local_180.key.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0014c1e3;
          }
          lStack_1b0 = 0;
          stack0xfffffffffffffe38 = 0;
          uStack_1c0 = 0;
          local_1d8._0_8_ = (pointer)0x0;
          local_1d8._8_8_ = 0;
          local_1a8 = (char *)0x0;
          local_1b8._0_4_ = -1;
          local_1b8._4_4_ = 0;
          readToken_abi_cxx11_(&local_228,&local_230,pEnd,'/');
          _Var1._M_p = local_228._M_dataplus._M_p;
          piVar3 = __errno_location();
          iVar2 = *piVar3;
          *piVar3 = 0;
          lVar4 = strtol(_Var1._M_p,&local_208,10);
          if (local_208 == _Var1._M_p) {
            std::__throw_invalid_argument("stoi");
LAB_0014cb4b:
            std::__throw_out_of_range("stoi");
LAB_0014cb57:
            std::__throw_invalid_argument("stoi");
LAB_0014cb63:
            std::__throw_out_of_range("stoi");
LAB_0014cb6f:
            std::__throw_invalid_argument("stoi");
LAB_0014cb7b:
            std::__throw_out_of_range("stoi");
LAB_0014cb87:
            std::__throw_invalid_argument("stoi");
LAB_0014cb93:
            std::__throw_out_of_range("stoi");
LAB_0014cb9f:
            std::__throw_invalid_argument("stoi");
LAB_0014cbab:
            std::__throw_out_of_range("stoi");
LAB_0014cbb7:
            std::__throw_invalid_argument("stoi");
LAB_0014cbc3:
            std::__throw_out_of_range("stoi");
          }
          else {
            if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_0014cb4b;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            iStack_1c4 = (int)lVar4 + -0x76c;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,'/');
            _Var1._M_p = local_228._M_dataplus._M_p;
            iVar2 = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 == _Var1._M_p) goto LAB_0014cb57;
            if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0014cb63;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_1d8._16_4_ = (int)lVar4 + -1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
            _Var1._M_p = local_228._M_dataplus._M_p;
            iVar2 = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 == _Var1._M_p) goto LAB_0014cb6f;
            if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0014cb7b;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_1d8._12_4_ = (int)lVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,':');
            _Var1._M_p = local_228._M_dataplus._M_p;
            iVar2 = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 == _Var1._M_p) goto LAB_0014cb87;
            if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0014cb93;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_1d8._8_4_ = (int)lVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,':');
            _Var1._M_p = local_228._M_dataplus._M_p;
            iVar2 = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 == _Var1._M_p) goto LAB_0014cb9f;
            if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0014cbab;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_1d8._4_4_ = (int)lVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,'.');
            _Var1._M_p = local_228._M_dataplus._M_p;
            iVar2 = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 == _Var1._M_p) goto LAB_0014cbb7;
            if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0014cbc3;
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_1d8._0_4_ = (int)lVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
            _Var1._M_p = local_228._M_dataplus._M_p;
            local_1dc = *piVar3;
            *piVar3 = 0;
            lVar4 = strtol(local_228._M_dataplus._M_p,&local_208,10);
            if (local_208 != _Var1._M_p) {
              if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22))
              goto LAB_0014cbdb;
              if (*piVar3 == 0) {
                *piVar3 = local_1dc;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              bVar7 = local_230 <= pEnd;
              if (pEnd < local_230) {
                if ((int)dataRefs.iLogLevel < 4) {
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                         ,0x160,"StreamProcessDataSBSLine",logERR,
                         "Line too short, not yet read actual data");
                }
              }
              else {
                tVar5 = mktime((tm *)local_1d8);
                iVar2 = timeOffsetUTC();
                dVar8 = (double)(int)lVar4 / 1000.0 + (double)(tVar5 + iVar2);
                (this->dyn).ts = dVar8;
                (this->pos)._ts = dVar8;
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  std::__cxx11::string::_M_assign((string *)&(this->stat).call);
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->pos)._alt = dVar8 * 0.3048;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->dyn).spd = dVar8;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->dyn).heading = dVar8;
                  (this->pos)._head = dVar8;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->pos)._lat = dVar8;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->pos)._lon = dVar8;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  dVar8 = std::__cxx11::stod(&local_200,(size_t *)0x0);
                  (this->dyn).vsi = dVar8;
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  lVar4 = std::__cxx11::stol(&local_200,(size_t *)0x0,10);
                  (this->dyn).radar.code = lVar4;
                }
                readToken_abi_cxx11_(&local_110,&local_230,pEnd,',');
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  local_110.field_2._M_allocated_capacity + 1);
                }
                readToken_abi_cxx11_(&local_130,&local_230,pEnd,',');
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                readToken_abi_cxx11_(&local_150,&local_230,pEnd,',');
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                readToken_abi_cxx11_(&local_228,&local_230,pEnd,',');
                lVar4 = std::__cxx11::string::operator=((string *)&local_200,(string *)&local_228);
                lVar4 = *(long *)(lVar4 + 8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  operator_delete(local_228._M_dataplus._M_p,
                                  local_228.field_2._M_allocated_capacity + 1);
                }
                if (lVar4 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)&local_200);
                  (this->dyn).gnd = iVar2 == 0;
                  (this->pos).f =
                       (posFlagsTy)
                       (((ushort)*(undefined4 *)&(this->pos).f & 0xfcff | (ushort)(iVar2 == 0) << 8)
                       + 0x100);
                }
              }
              goto LAB_0014cb15;
            }
          }
          std::__throw_invalid_argument("stoi");
LAB_0014cbdb:
          uVar6 = std::__throw_out_of_range("stoi");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180.key._M_dataplus._M_p != &local_180.key.field_2) {
            operator_delete(local_180.key._M_dataplus._M_p,
                            local_180.key.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar6);
        }
        lvl = logDEBUG;
        bVar7 = false;
        if (0 < (int)dataRefs.iLogLevel) goto LAB_0014c1e3;
        szMsg = "ADS-B hex id was empty";
        iVar2 = 0x143;
      }
LAB_0014c1cc:
      bVar7 = false;
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,iVar2,"StreamProcessDataSBSLine",lvl,szMsg);
      goto LAB_0014c1e3;
    }
    if ((int)dataRefs.iLogLevel < 4) {
      szMsg = "Line too short, not even read an ADS-B hex id yet";
      lvl = logERR;
      iVar2 = 0x13d;
      goto LAB_0014c1cc;
    }
  }
  else if ((int)dataRefs.iLogLevel < 1) {
    bVar7 = false;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
           ,0x135,"StreamProcessDataSBSLine",logDEBUG,"Ignoring line of type \'%s\'",
           local_200._M_dataplus._M_p);
    goto LAB_0014c1e3;
  }
LAB_0014be61:
  bVar7 = false;
LAB_0014c1e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBSLine (const char* pStart, const char* pEnd)
{
    // Line must start with 'MSG', otherwise we ignore
    std::string token = readToken(pStart, pEnd);
    if (token != "MSG") {
        LOG_MSG(logDEBUG, "Ignoring line of type '%s'", token.c_str());
        return false;
    }
    
    // Ignore 3 fields (transmission type, session ID, aircraft id)
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not even read an ADS-B hex id yet");
    
    // Read the ADS-B hex id
    token = readToken(pStart, pEnd);
    TEST_END("just only read an ADS-B hex id");
    if (token.empty()) {
        LOG_MSG(logDEBUG, "ADS-B hex id was empty");
        return false;
    }
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO, token);
    
    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // Skip over FlightID and date/time message created
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    TEST_END("not yet read date/time of message created");
    
    // Date/time message logged
    std::tm tm;
    memset(&tm, 0, sizeof(tm));
    tm.tm_isdst = -1;               // re-lookup DST info
    tm.tm_year = std::stoi(readToken(pStart, pEnd, '/')) - 1900;
    tm.tm_mon  = std::stoi(readToken(pStart, pEnd, '/')) - 1;
    tm.tm_mday = std::stoi(readToken(pStart, pEnd));
    tm.tm_hour = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_min  = std::stoi(readToken(pStart, pEnd, ':'));
    tm.tm_sec  = std::stoi(readToken(pStart, pEnd, '.'));
    int ms     = std::stoi(readToken(pStart, pEnd));
    TEST_END("not yet read actual data");
    time_t ts = mktime_utc(tm);
    pos.ts() = dyn.ts = double(ts) + double(ms) / 1000.0;
    
    // Call sign
    if (!(token = readToken(pStart, pEnd)).empty())
        stat.call = token;
    
    // Altitude, supposingly "HAE" = Height above ellipsoid
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.SetAltFt(std::stod(token));

    // Ground Speed
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.spd = std::stod(token);
    
    // Track (it is not heading...but best we have, we don't get heading)
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.heading() = dyn.heading = std::stod(token);
    
    // Latitude, Longitude
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lat() = std::stod(token);
    if (!(token = readToken(pStart, pEnd)).empty())
        pos.lon() = std::stod(token);

    // VSI
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.vsi = std::stod(token);

    // Squawk
    if (!(token = readToken(pStart, pEnd)).empty())
        dyn.radar.code = std::stol(token);

    // Skip over Alert, Emergency, SPI flags
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);
    readToken(pStart, pEnd);

    // Ground flag
    if (!(token = readToken(pStart, pEnd)).empty()) {
        dyn.gnd = token == "1";
        pos.f.onGrnd = dyn.gnd ? GND_ON : GND_OFF;
    }
    
    return true;
}